

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_append_abilities(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  undefined8 uVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  monster_sex_t mVar6;
  int flag;
  int iVar7;
  wchar_t wVar8;
  wchar_t flag_00;
  char *__s2;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  bitflag current_flags [12];
  bitflag test_flags [12];
  char start [40];
  
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                  ,0x50b,
                  "void lore_append_abilities(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  mVar6 = lore_monster_sex(race);
  lVar9 = (ulong)mVar6 * 0x10;
  uVar1 = *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + lVar9 + 8);
  create_mon_flag_mask(current_flags,8,0xf);
  flag_inter(current_flags,known_flags,0xc);
  strnfmt(start,0x28,"%s can ",uVar1);
  lore_append_clause(tb,current_flags,'\x01',start,"and",".  ");
  create_mon_flag_mask(current_flags,7,0xf);
  flag_inter(current_flags,known_flags,0xc);
  strnfmt(start,0x28,"%s is ",uVar1);
  lore_append_clause(tb,current_flags,'\x01',start,"and",".  ");
  _Var2 = flag_has_dbg(known_flags,0xc,0x16,"known_flags","RF_UNAWARE");
  if (_Var2) {
    textblock_append(tb,"%s disguises itself as something else.  ",uVar1);
  }
  _Var2 = flag_has_dbg(known_flags,0xc,0x17,"known_flags","RF_MULTIPLY");
  if (_Var2) {
    textblock_append_c(tb,'\x03',"%s breeds explosively.  ",uVar1);
  }
  _Var2 = flag_has_dbg(known_flags,0xc,0x18,"known_flags","RF_REGENERATE");
  if (_Var2) {
    textblock_append(tb,"%s regenerates quickly.  ",uVar1);
  }
  _Var2 = flag_has_dbg(known_flags,0xc,0x22,"known_flags","RF_FLYING");
  if (_Var2) {
    textblock_append(tb,"%s can fly.  ",uVar1);
  }
  _Var2 = flag_has_dbg(known_flags,0xc,0x25,"known_flags","RF_TERRITORIAL");
  if (_Var2) {
    textblock_append(tb,"%s is more aggressive in %s own territory.  ",uVar1,
                     *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + lVar9));
  }
  wVar8 = race->light;
  if (wVar8 < L'\x02') {
    if (wVar8 == L'\xffffffff') {
      pcVar11 = "%s is darkened.  ";
    }
    else {
      if (wVar8 != L'\x01') {
        if (L'\xfffffffe' < wVar8) goto LAB_00172d51;
        uVar10 = *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + lVar9);
        pcVar11 = "%s shrouds %s surroundings in darkness.  ";
        goto LAB_00172d17;
      }
      pcVar11 = "%s is illuminated.  ";
    }
    textblock_append(tb,pcVar11,uVar1);
  }
  else {
    uVar10 = *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + lVar9);
    pcVar11 = "%s illuminates %s surroundings.  ";
LAB_00172d17:
    textblock_append(tb,pcVar11,uVar1,uVar10);
  }
LAB_00172d51:
  create_mon_flag_mask(current_flags,0xb,0xc,0xf);
  flag_inter(current_flags,known_flags,0xc);
  strnfmt(start,0x28,"%s is hurt by ",uVar1);
  lore_append_clause(tb,current_flags,'\x11',start,"and","");
  _Var2 = flag_is_empty(current_flags,0xc);
  create_mon_flag_mask(current_flags,0xd,0xf);
  flag_inter(current_flags,known_flags,0xc);
  create_mon_flag_mask(test_flags,0xb,0xf);
  iVar7 = 1;
  flag = flag_next(test_flags,0xc,1);
  for (; flag != 0; flag = flag_next(test_flags,0xc,flag + 1)) {
    _Var3 = flag_has_dbg(lore->flags,0xc,flag,"lore->flags","flag");
    if (_Var3) {
      _Var3 = flag_has_dbg(known_flags,0xc,flag,"known_flags","flag");
      if (!_Var3) {
        flag_on_dbg(current_flags,0xc,flag,"current_flags","flag");
      }
    }
  }
  if (_Var2) {
    strnfmt(start,0x28,"%s resists ",uVar1);
  }
  else {
    my_strcpy(start,", but resists ",0x28);
  }
  lore_append_clause(tb,current_flags,'\x0f',start,"and","");
  _Var3 = flag_is_empty(current_flags,0xc);
  flag_wipe(current_flags,0xc);
  create_mon_flag_mask(test_flags,0xd,0xf);
  while( true ) {
    iVar7 = flag_next(test_flags,0xc,iVar7);
    if (iVar7 == 0) break;
    _Var4 = flag_has_dbg(lore->flags,0xc,iVar7,"lore->flags","flag");
    if (_Var4) {
      _Var4 = flag_has_dbg(known_flags,0xc,iVar7,"known_flags","flag");
      if (!_Var4) {
        flag_on_dbg(current_flags,0xc,iVar7,"current_flags","flag");
      }
    }
    iVar7 = iVar7 + 1;
  }
  create_mon_flag_mask(test_flags,0xc,0xf);
  flag_inter(test_flags,known_flags,0xc);
  iVar7 = 1;
  while( true ) {
    wVar8 = flag_next(test_flags,0xc,iVar7);
    if (wVar8 == L'\0') break;
    iVar7 = 1;
    while( true ) {
      flag_00 = flag_next(current_flags,0xc,iVar7);
      if (flag_00 == L'\0') break;
      pcVar11 = describe_race_flag(wVar8);
      __s2 = describe_race_flag(flag_00);
      iVar7 = strcmp(pcVar11,__s2);
      if (iVar7 == 0) {
        flag_off(current_flags,0xc,flag_00);
      }
      iVar7 = flag_00 + L'\x01';
    }
    iVar7 = wVar8 + L'\x01';
  }
  if (_Var3 && _Var2) {
    strnfmt(start,0x28,"%s does not resist ",uVar1);
  }
  else {
    my_strcpy(start,", and does not resist ",0x28);
  }
  _Var4 = flag_has_dbg(known_flags,0xc,0x49,"known_flags","RF_UNDEAD");
  if (_Var4) {
    flag_off(current_flags,0xc,0x55);
  }
  lore_append_clause(tb,current_flags,'\x0f',start,"or","");
  _Var4 = flag_is_empty(current_flags,0xc);
  create_mon_flag_mask(current_flags,0xe,0xf);
  flag_inter(current_flags,known_flags,0xc);
  if (_Var4 && (_Var3 && _Var2)) {
    strnfmt(start,0x28,"%s cannot be ",uVar1);
  }
  else {
    my_strcpy(start,", and cannot be ",0x28);
  }
  lore_append_clause(tb,current_flags,'\x0f',start,"or","");
  _Var5 = flag_is_empty(current_flags,0xc);
  if (!_Var5 || (!_Var4 || (!_Var3 || !_Var2))) {
    textblock_append(tb,".  ");
  }
  return;
}

Assistant:

void lore_append_abilities(textblock *tb, const struct monster_race *race,
						   const struct monster_lore *lore,
						   bitflag known_flags[RF_SIZE])
{
	int flag;
	char start[40];
	const char *initial_pronoun;
	bool prev = false;
	bitflag current_flags[RF_SIZE], test_flags[RF_SIZE];
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) and get a pronoun for the start of
	 * sentences */
	msex = lore_monster_sex(race);
	initial_pronoun = lore_pronoun_nominative(msex, true);

	/* Describe environment-shaping abilities. */
	create_mon_flag_mask(current_flags, RFT_ALTER, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s can ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_WHITE, start, "and", ".  ");

	/* Describe detection traits */
	create_mon_flag_mask(current_flags, RFT_DET, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s is ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_WHITE, start, "and", ".  ");

	/* Describe special things */
	if (rf_has(known_flags, RF_UNAWARE))
		textblock_append(tb, "%s disguises itself as something else.  ",
						 initial_pronoun);
	if (rf_has(known_flags, RF_MULTIPLY))
		textblock_append_c(tb, COLOUR_ORANGE, "%s breeds explosively.  ",
						   initial_pronoun);
	if (rf_has(known_flags, RF_REGENERATE))
		textblock_append(tb, "%s regenerates quickly.  ", initial_pronoun);
	if (rf_has(known_flags, RF_FLYING))
		textblock_append(tb, "%s can fly.  ", initial_pronoun);
	if (rf_has(known_flags, RF_TERRITORIAL))
		textblock_append(tb, "%s is more aggressive in %s own territory.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));

	/* Describe light */
	if (race->light > 1) {
		textblock_append(tb, "%s illuminates %s surroundings.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));
	} else if (race->light == 1) {
		textblock_append(tb, "%s is illuminated.  ", initial_pronoun);
	} else if (race->light == -1) {
		textblock_append(tb, "%s is darkened.  ", initial_pronoun);
	} else if (race->light < -1) {
		textblock_append(tb, "%s shrouds %s surroundings in darkness.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));
	}

	/* Collect susceptibilities */
	create_mon_flag_mask(current_flags, RFT_VULN, RFT_VULN_I, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s is hurt by ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_VIOLET, start, "and", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect immunities and resistances */
	create_mon_flag_mask(current_flags, RFT_RES, RFT_MAX);
	rf_inter(current_flags, known_flags);

	/* Note lack of vulnerability as a resistance */
	create_mon_flag_mask(test_flags, RFT_VULN, RFT_MAX);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		if (rf_has(lore->flags, flag) && !rf_has(known_flags, flag)) {
			rf_on(current_flags, flag);
		}
	}
	if (prev) {
		my_strcpy(start, ", but resists ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s resists ", initial_pronoun);
	}
	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "and", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect known but average susceptibilities */
	rf_wipe(current_flags);
	create_mon_flag_mask(test_flags, RFT_RES, RFT_MAX);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		if (rf_has(lore->flags, flag) && !rf_has(known_flags, flag)) {
			rf_on(current_flags, flag);
		}
	}

	/* Vulnerabilities need to be specifically removed */
	create_mon_flag_mask(test_flags, RFT_VULN_I, RFT_MAX);
	rf_inter(test_flags, known_flags);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		int susc_flag;
		for (susc_flag = rf_next(current_flags, FLAG_START); susc_flag;
			 susc_flag = rf_next(current_flags, susc_flag + 1)) {
			if (streq(describe_race_flag(flag), describe_race_flag(susc_flag)))
				rf_off(current_flags, susc_flag);
		}
	}
	if (prev) {
		my_strcpy(start, ", and does not resist ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s does not resist ",
			initial_pronoun);
	}

	/* Special case for undead */
	if (rf_has(known_flags, RF_UNDEAD)) {
		rf_off(current_flags, RF_IM_NETHER);
	}

	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "or", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect non-effects */
	create_mon_flag_mask(current_flags, RFT_PROT, RFT_MAX);
	rf_inter(current_flags, known_flags);
	if (prev) {
		my_strcpy(start, ", and cannot be ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s cannot be ", initial_pronoun);
	}
	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "or", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	if (prev)
		textblock_append(tb, ".  ");
}